

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O0

void toml::detail::
     change_region<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
               (basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *v,region *reg)

{
  undefined1 local_28 [24];
  region *reg_local;
  basic_value<toml::discard_comments,_std::unordered_map,_std::vector> *v_local;
  
  local_28._16_8_ = reg;
  reg_local = (region *)v;
  std::make_shared<toml::detail::region,toml::detail::region>((region *)local_28);
  std::shared_ptr<toml::detail::region_base>::operator=
            ((shared_ptr<toml::detail::region_base> *)((long)&(reg_local->source_name_).field_2 + 8)
             ,(shared_ptr<toml::detail::region> *)local_28);
  std::shared_ptr<toml::detail::region>::~shared_ptr((shared_ptr<toml::detail::region> *)local_28);
  return;
}

Assistant:

void change_region(Value& v, region reg)
{
    v.region_info_ = std::make_shared<region>(std::move(reg));
    return;
}